

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

int __thiscall sysapi::epoll::run_timers_calculate_timeout(epoll *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  time_point now;
  time_point tVar3;
  int iVar4;
  timer *this_00;
  
  this_00 = &this->timer_;
  bVar2 = timer::empty(this_00);
  iVar4 = -1;
  if (!bVar2) {
    now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    timer::notify(this_00,now);
    bVar2 = timer::empty(this_00);
    if (!bVar2) {
      tVar3 = timer::top(this_00);
      auVar1 = SEXT816((long)tVar3.__d.__r - (long)now.__d.__r) * SEXT816(0x431bde82d7b634db);
      iVar4 = (int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f);
    }
  }
  return iVar4;
}

Assistant:

int epoll::run_timers_calculate_timeout()
{
    if (timer_.empty())
        return -1;

    timer::clock_t::time_point now = timer::clock_t::now();
    timer_.notify(now);

    if (timer_.empty())
        return -1;

    return std::chrono::duration_cast<std::chrono::milliseconds>(timer_.top() - now).count();
}